

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Minefield_Data_PDU::AddMine(Minefield_Data_PDU *this,Mine *M)

{
  KUINT16 *pKVar1;
  KException *this_00;
  KUINT16 KVar2;
  KBOOL KVar3;
  undefined1 extraout_AL;
  undefined1 extraout_AH;
  undefined6 extraout_var;
  allocator<char> local_39;
  KString local_38;
  
  KVar3 = DATA_TYPE::MinefieldDataFilter::operator!=
                    (&M->super_MinefieldDataFilter,&this->m_DataFilter);
  if (!KVar3) {
    std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::push_back
              (&this->m_vMines,M);
    KVar2 = DATA_TYPE::Mine::GetLength(M);
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar2;
    this->m_ui8NumMines = this->m_ui8NumMines + '\x01';
    return;
  }
  __cxa_allocate_exception(0x30);
  this_00 = (KException *)CONCAT62(extraout_var,CONCAT11(extraout_AH,extraout_AL));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddMine",&local_39);
  KException::KException<char_const*>
            (this_00,&local_38,10,
             "The Mine filter does not match the PDU MinefieldDataFilter.\t\t\t                                                            All mines must have the same optional values set as specified by\t                                                            the PDU MinefieldDataFilter. This mine has been ignored."
            );
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Data_PDU::AddMine(const Mine &M) noexcept(false)
{
    // First check the mine has the same optional fields set as MinefieldDataFilter.
    if( M.MinefieldDataFilter::operator != ( m_DataFilter ) )
    {
        throw KException( __FUNCTION__, INVALID_OPERATION, "The Mine filter does not match the PDU MinefieldDataFilter.			\
                                                            All mines must have the same optional values set as specified by	\
                                                            the PDU MinefieldDataFilter. This mine has been ignored." );
    }

    m_vMines.push_back( M );
    m_ui16PDULength += M.GetLength();
    ++m_ui8NumMines;
}